

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O1

char * duckdb::NumericHelper::FormatUnsigned<unsigned_int>(uint value,char *ptr)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  long lVar4;
  
  uVar2 = value;
  if (99 < value) {
    do {
      value = uVar2 / 100;
      *(undefined2 *)(ptr + -2) =
           *(undefined2 *)
            (duckdb_fmt::v6::internal::basic_data<void>::digits + (ulong)(uVar2 % 100) * 2);
      ptr = ptr + -2;
      bVar1 = 9999 < uVar2;
      uVar2 = uVar2 / 100;
    } while (bVar1);
  }
  if (value < 10) {
    cVar3 = NumericCastImpl<char,_unsigned_int,_false>::Convert(value | 0x30);
    lVar4 = -1;
  }
  else {
    ptr[-1] = duckdb_fmt::v6::internal::basic_data<void>::digits
              [((ulong)value * 2 & 0xffffffff) + 1];
    cVar3 = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)value * 2];
    lVar4 = -2;
  }
  ptr[lVar4] = cVar3;
  return ptr + lVar4;
}

Assistant:

static char *FormatUnsigned(T value, char *ptr) {
		while (value >= 100) {
			// Integer division is slow so do it for a group of two digits instead
			// of for every digit. The idea comes from the talk by Alexandrescu
			// "Three Optimization Tips for C++".
			auto index = NumericCast<unsigned>((value % 100) * 2);
			value /= 100;
			*--ptr = duckdb_fmt::internal::data::digits[index + 1];
			*--ptr = duckdb_fmt::internal::data::digits[index];
		}
		if (value < 10) {
			*--ptr = NumericCast<char>('0' + value);
			return ptr;
		}
		auto index = NumericCast<unsigned>(value * 2);
		*--ptr = duckdb_fmt::internal::data::digits[index + 1];
		*--ptr = duckdb_fmt::internal::data::digits[index];
		return ptr;
	}